

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.h
# Opt level: O2

void __thiscall sptk::SymmetricMatrix::~SymmetricMatrix(SymmetricMatrix *this)

{
  ~SymmetricMatrix(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~SymmetricMatrix() {
  }